

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O2

FT_Error fnt_cmap_init(FNT_CMap cmap,FT_Pointer pointer)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = (cmap->cmap).charmap.face[1].num_faces;
  uVar2 = (uint)*(byte *)(lVar1 + 0x74);
  cmap->first = uVar2;
  cmap->count = (*(byte *)(lVar1 + 0x75) - uVar2) + 1;
  return 0;
}

Assistant:

static FT_Error
  fnt_cmap_init( FNT_CMap    cmap,
                 FT_Pointer  pointer )
  {
    FNT_Face  face = (FNT_Face)FT_CMAP_FACE( cmap );
    FNT_Font  font = face->font;

    FT_UNUSED( pointer );


    cmap->first = (FT_UInt32)  font->header.first_char;
    cmap->count = (FT_UInt32)( font->header.last_char - cmap->first + 1 );

    return 0;
  }